

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O3

void __thiscall Am_Point_List::Set(Am_Point_List *this,float x,float y,bool unique)

{
  Am_Point_Item **ppAVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_Point_Item *pAVar3;
  Am_Point_List_Data *pAVar4;
  
  pAVar4 = this->data;
  if ((pAVar4 != (Am_Point_List_Data *)0x0 && unique) && ((pAVar4->super_Am_Wrapper).refs != 1)) {
    iVar2 = (*(pAVar4->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])();
    pAVar3 = this->item;
    pAVar4 = (Am_Point_List_Data *)CONCAT44(extraout_var,iVar2);
    if (pAVar3 != (Am_Point_Item *)0x0) {
      do {
        pAVar3 = pAVar3->prev;
        ppAVar1 = &pAVar4->head;
        pAVar4 = (Am_Point_List_Data *)*ppAVar1;
      } while (pAVar3 != (Am_Point_Item *)0x0);
      this->item = *ppAVar1;
    }
    this->data = (Am_Point_List_Data *)CONCAT44(extraout_var,iVar2);
  }
  pAVar3 = this->item;
  if (pAVar3 == (Am_Point_Item *)0x0) {
    Am_Error("Set called while no item is current\n");
  }
  pAVar3->x = x;
  pAVar3->y = y;
  return;
}

Assistant:

void
Am_Point_List::Set(float x, float y, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  }
  data->Set(x, y, item);
}